

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Extractor::Extractor(Extractor *this,Net *_net,size_t blob_count)

{
  size_type in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Option *in_RDI;
  
  *(vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> **)in_RDI = in_RSI;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x12da42);
  Option::Option(in_RDI);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(in_RSI,in_RDX);
  memcpy(&in_RDI->use_int8_arithmetic,*(void **)in_RDI,0x24);
  return;
}

Assistant:

Extractor::Extractor(const Net* _net, size_t blob_count) : net(_net)
{
    blob_mats.resize(blob_count);
    opt = net->opt;

#if NCNN_VULKAN
    if (net->opt.use_vulkan_compute)
    {
        local_blob_vkallocator = 0;
        local_staging_vkallocator = 0;

        blob_mats_gpu.resize(blob_count);
    }
#endif // NCNN_VULKAN
}